

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::CompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t inSize,
               vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channelInfo,
               int data_width,int num_lines)

{
  long *plVar1;
  ushort uVar2;
  uint uVar3;
  size_t __n;
  pointer puVar4;
  int i;
  int iVar5;
  int iVar6;
  unsigned_short *puVar7;
  pointer pPVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  ulong uVar15;
  short bs_1;
  int iVar16;
  long lVar17;
  int iVar18;
  int *piVar19;
  ushort uVar20;
  int iVar21;
  uint uVar22;
  ushort *__dest;
  long lVar23;
  ushort *puVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ushort *puVar28;
  long unaff_R14;
  long lVar29;
  uint uVar30;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  int n;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  ushort uStack_2213c;
  ushort uStack_2213a;
  ulong uStack_22138;
  long lStack_22130;
  uint uStack_22128;
  int iStack_22124;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> vStack_22120;
  long lStack_22108;
  ulong uStack_22100;
  uint uStack_220f8;
  int iStack_220f4;
  ushort *puStack_220f0;
  ushort *puStack_220e8;
  pointer pPStack_220e0;
  long lStack_220d8;
  ushort *puStack_220d0;
  long lStack_220c8;
  long lStack_220c0;
  ulong uStack_220b8;
  long lStack_220b0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_220a8;
  unsigned_short *puStack_22090;
  long lStack_22088;
  uint *puStack_22080;
  long lStack_22078;
  long lStack_22070;
  long lStack_22068;
  long lStack_22060;
  long lStack_22058;
  ushort *puStack_22050;
  long lStack_22048;
  ushort *puStack_22040;
  byte abStack_22038 [8192];
  allocator_type aaStack_20038 [131080];
  
  puStack_220e8 = (ushort *)outPtr;
  puStack_22080 = outSize;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&vStack_220a8,inSize >> 1,aaStack_20038);
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
            (&vStack_22120,
             ((long)(channelInfo->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(channelInfo->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)aaStack_20038);
  if (vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    if ((long)vStack_22120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)vStack_22120.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar17 = (long)vStack_22120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vStack_22120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar17 = lVar17 + (ulong)(lVar17 == 0);
      piVar14 = &(vStack_22120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      piVar19 = &((channelInfo->
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                  _M_impl.super__Vector_impl_data._M_start)->pixel_type;
      puVar7 = vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar14 + -7))->start = puVar7;
        *(unsigned_short **)(piVar14 + -5) = puVar7;
        piVar14[-3] = data_width;
        piVar14[-2] = num_lines;
        iVar6 = *piVar19;
        *piVar14 = (iVar6 != 1) + 1;
        puVar7 = puVar7 + (num_lines * data_width << (iVar6 != 1));
        piVar14 = piVar14 + 8;
        piVar19 = piVar19 + 0xc;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    if (0 < num_lines) {
      uVar15 = 0;
      do {
        uStack_22100 = uVar15;
        if (vStack_22120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            vStack_22120.
            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar17 = 8;
          uVar15 = 0;
          do {
            pPVar8 = vStack_22120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar29 = (long)*(int *)((long)&(vStack_22120.
                                            super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->ny + lVar17)
                     * (long)*(int *)((long)&(vStack_22120.
                                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->end +
                                     lVar17);
            __n = lVar29 * 2;
            memcpy(*(void **)((long)&(vStack_22120.
                                      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->start + lVar17),
                   inPtr,__n);
            plVar1 = (long *)((long)&pPVar8->start + lVar17);
            *plVar1 = *plVar1 + __n;
            inPtr = inPtr + lVar29 * 2;
            uVar15 = uVar15 + 1;
            lVar17 = lVar17 + 0x20;
          } while (uVar15 < (ulong)((long)vStack_22120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)vStack_22120.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar10 = (int)uStack_22100 + 1;
        uVar15 = (ulong)uVar10;
      } while (uVar10 != num_lines);
    }
    puVar4 = vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    unaff_R14 = (long)vStack_220a8.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vStack_220a8.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start >> 1;
    if (vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar10 = (uint)unaff_R14;
      bitmapFromData(vStack_220a8.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,uVar10,abStack_22038,&uStack_2213a,
                     &uStack_2213c);
      uVar15 = 0;
      uStack_22138 = 0;
      do {
        if ((uVar15 == 0) ||
           ((abStack_22038[uVar15 >> 3 & 0x1fffffff] >> ((uint)uVar15 & 7) & 1) != 0)) {
          iVar6 = (int)uStack_22138;
          uStack_22138 = (ulong)(iVar6 + 1);
        }
        else {
          iVar6 = 0;
        }
        *(short *)(aaStack_20038 + uVar15 * 2) = (short)iVar6;
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x10000);
      if (0 < (int)uVar10) {
        uVar15 = 0;
        do {
          puVar4[uVar15] = *(unsigned_short *)(aaStack_20038 + (ulong)puVar4[uVar15] * 2);
          uVar15 = uVar15 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar15);
      }
      *puStack_220e8 = uStack_2213a;
      puStack_220e8[1] = uStack_2213c;
      __dest = puStack_220e8 + 2;
      puStack_22090 = puVar4;
      lStack_22088 = unaff_R14;
      if (uStack_2213a <= uStack_2213c) {
        lVar17 = (ulong)uStack_2213c - (ulong)uStack_2213a;
        memcpy(__dest,abStack_22038 + uStack_2213a,lVar17 + 1);
        __dest = (ushort *)((long)__dest + lVar17 + 1);
      }
      pPStack_220e0 =
           vStack_22120.
           super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if ((long)vStack_22120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vStack_22120.
                super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        uVar10 = (int)uStack_22138 - 1;
        uStack_22138 = (ulong)uVar10;
        lStack_22078 = (long)vStack_22120.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vStack_22120.
                             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
        lStack_22078 = lStack_22078 + (ulong)(lStack_22078 == 0);
        lVar17 = 0;
        do {
          lStack_22070 = lVar17;
          iVar6 = vStack_22120.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start[lStack_22070].size;
          lStack_22130 = (long)iVar6;
          if (0 < lStack_22130) {
            pPVar8 = vStack_22120.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start + lStack_22070;
            puVar7 = pPVar8->start;
            uVar3 = pPVar8->nx;
            uStack_220f8 = pPVar8->ny;
            iStack_22124 = uVar3 * iVar6;
            uStack_22128 = uStack_220f8;
            if ((int)uVar3 < (int)uStack_220f8) {
              uStack_22128 = uVar3;
            }
            lStack_220d8 = 0;
            lStack_22108 = 0;
            do {
              if (1 < (int)uStack_22128) {
                puStack_220d0 = puVar7 + lStack_22108;
                uVar15 = 2;
                uVar13 = 1;
                do {
                  uStack_220b8 = uVar15;
                  uVar12 = (uint)uStack_220b8;
                  iVar5 = (uStack_220f8 - uVar12) * iStack_22124;
                  lStack_220c0 = (long)(int)(uVar13 * iVar6);
                  lStack_220c8 = (long)(int)(uVar12 * iVar6);
                  uVar30 = uVar10 & 0xffff;
                  puVar24 = puStack_220d0;
                  if (-1 < iVar5) {
                    puStack_22050 = puStack_220d0 + iVar5;
                    iStack_220f4 = (uVar3 - uVar12) * iVar6;
                    lStack_22068 = (long)iStack_220f4;
                    lStack_220b0 = (long)(int)(uVar13 * iStack_22124);
                    lStack_22058 = (long)(int)(uVar12 * iStack_22124);
                    lStack_22060 = lStack_22058 * 2;
                    uStack_22100 = lStack_220c8 * 2;
                    lVar17 = lStack_220c0 * 2 + lStack_220b0 * 2;
                    lVar29 = lStack_220d8;
                    do {
                      puVar28 = puVar24;
                      if (-1 < iStack_220f4) {
                        lVar23 = lVar29;
                        do {
                          uVar25 = (uint)*(short *)((long)puVar7 + lVar23);
                          uVar2 = *(ushort *)((long)puVar7 + lVar23 + lStack_220c0 * 2);
                          if (uVar30 < 0x4000) {
                            iVar21 = uVar25 - (int)(short)uVar2;
                            iVar16 = (int)*(short *)((long)puVar7 + lVar23 + lStack_220b0 * 2);
                            iVar5 = (int)*(short *)((long)puVar7 + lVar23 + lVar17);
                            iVar18 = iVar16 - iVar5;
                            uVar25 = (int)(short)uVar2 + uVar25;
                            uVar11 = iVar5 + iVar16;
                            *(short *)((long)puVar7 + lVar23) =
                                 (short)((uint)(((int)uVar25 >> 1) + ((int)uVar11 >> 1)) >> 1);
                            *(short *)((long)puVar7 + lVar23 + lStack_220b0 * 2) =
                                 (short)(uVar25 >> 1) - (short)(uVar11 >> 1);
                            iVar5 = iVar21 - iVar18;
                            *(short *)((long)puVar7 + lVar23 + lStack_220c0 * 2) =
                                 (short)((uint)((int)(short)iVar21 + (int)(short)iVar18) >> 1);
                          }
                          else {
                            uVar26 = (uVar25 ^ 0x8000) & 0xffff;
                            uVar27 = uVar26 - uVar2;
                            uVar25 = (uint)*(ushort *)((long)puVar7 + lVar23 + lVar17);
                            uVar11 = *(ushort *)((long)puVar7 + lVar23 + lStack_220b0 * 2) ^ 0x8000;
                            uVar22 = uVar11 - uVar25;
                            uVar11 = uVar22 >> 0x10 & 0x8000 ^ uVar11 + uVar25 >> 1;
                            uVar25 = uVar2 + uVar26 >> 1 ^ 0x8000 ^ uVar27 >> 0x10 & 0x8000;
                            iVar5 = uVar25 - uVar11;
                            *(ushort *)((long)puVar7 + lVar23) =
                                 (ushort)((uint)iVar5 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar11 + uVar25 >> 1);
                            *(short *)((long)puVar7 + lVar23 + lStack_220b0 * 2) = (short)iVar5;
                            uVar25 = uVar27 & 0xffff ^ 0x8000;
                            uVar22 = uVar22 & 0xffff;
                            iVar5 = uVar25 - uVar22;
                            *(ushort *)((long)puVar7 + lVar23 + lStack_220c0 * 2) =
                                 (ushort)((uint)iVar5 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar22 + uVar25 >> 1);
                          }
                          *(short *)((long)puVar7 + lVar23 + lVar17) = (short)iVar5;
                          lVar23 = lVar23 + uStack_22100;
                          puVar28 = (ushort *)((long)puVar7 + lVar23);
                          lStack_22048 = lVar29;
                          puStack_22040 = puVar24;
                        } while (puVar28 <= puVar24 + lStack_22068);
                      }
                      if ((uVar3 & uVar13) != 0) {
                        uVar25 = (uint)(short)*puVar28;
                        uVar2 = puVar28[lStack_220b0];
                        if (uVar30 < 0x4000) {
                          uVar20 = (ushort)((int)(short)uVar2 + uVar25 >> 1);
                          iVar5 = uVar25 - (int)(short)uVar2;
                        }
                        else {
                          uVar25 = (uVar25 ^ 0x8000) & 0xffff;
                          iVar5 = uVar25 - uVar2;
                          uVar20 = (ushort)((uint)iVar5 >> 0x10) & 0x8000 ^
                                   (ushort)(uVar25 + uVar2 >> 1);
                        }
                        puVar28[lStack_220b0] = (ushort)iVar5;
                        *puVar28 = uVar20;
                      }
                      puVar24 = puVar24 + lStack_22058;
                      lVar29 = lVar29 + lStack_22060;
                    } while (puVar24 <= puStack_22050);
                  }
                  if (((uVar13 & uStack_220f8) != 0) &&
                     (iVar5 = (uVar3 - uVar12) * iVar6, -1 < iVar5)) {
                    puVar28 = puVar24 + iVar5;
                    do {
                      uVar13 = (uint)(short)*puVar24;
                      uVar2 = puVar24[lStack_220c0];
                      if (uVar30 < 0x4000) {
                        uVar20 = (ushort)((int)(short)uVar2 + uVar13 >> 1);
                        iVar5 = uVar13 - (int)(short)uVar2;
                      }
                      else {
                        uVar13 = (uVar13 ^ 0x8000) & 0xffff;
                        iVar5 = uVar13 - uVar2;
                        uVar20 = (ushort)((uint)iVar5 >> 0x10) & 0x8000 ^
                                 (ushort)(uVar13 + uVar2 >> 1);
                      }
                      puVar24[lStack_220c0] = (ushort)iVar5;
                      *puVar24 = uVar20;
                      puVar24 = puVar24 + lStack_220c8;
                    } while (puVar24 <= puVar28);
                  }
                  uVar15 = (ulong)(uVar12 * 2);
                  uVar13 = uVar12;
                } while ((int)(uVar12 * 2) <= (int)uStack_22128);
              }
              lStack_22108 = lStack_22108 + 1;
              lStack_220d8 = lStack_220d8 + 2;
            } while (lStack_22108 != lStack_22130);
          }
          lVar17 = lStack_22070 + 1;
        } while (lStack_22070 + 1 != lStack_22078);
      }
      __dest[0] = 0;
      __dest[1] = 0;
      puStack_220f0 = __dest;
      iVar6 = hufCompress(puStack_22090,(int)lStack_22088,(char *)(__dest + 2));
      *(int *)__dest = iVar6;
      *puStack_22080 = ((int)(__dest + 2) - (int)puStack_220e8) + iVar6;
      if (vStack_22120.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_22120.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_22120.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_22120.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
        operator_delete(vStack_220a8.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_220a8.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_220a8.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return true;
    }
  }
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     unaff_R14);
  if (vStack_22120.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_22120.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_22120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_22120.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(vStack_220a8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220a8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220a8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

bool CompressPiz(unsigned char *outPtr, unsigned int &outSize,
                 const unsigned char *inPtr, size_t inSize,
                 const std::vector<ChannelInfo> &channelInfo, int data_width,
                 int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  // Assume `inSize` is multiple of 2 or 4.
  std::vector<unsigned short> tmpBuffer(inSize / sizeof(unsigned short));

  std::vector<PIZChannelData> channelData(channelInfo.size());
  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t c = 0; c < channelData.size(); c++) {
    PIZChannelData &cd = channelData[c];

    cd.start = tmpBufferEnd;
    cd.end = cd.start;

    cd.nx = data_width;
    cd.ny = num_lines;
    // cd.ys = c.channel().ySampling;

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (channelInfo[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    cd.size = pixelSize / sizeof(short);

    tmpBufferEnd += cd.nx * cd.ny * cd.size;
  }

  const unsigned char *ptr = inPtr;
  for (int y = 0; y < num_lines; ++y) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(cd.end, ptr, n * sizeof(unsigned short));
      ptr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  bitmapFromData(&tmpBuffer.at(0), tmpBuffer.size(), bitmap, minNonZero,
                 maxNonZero);

  unsigned short lut[USHORT_RANGE];
  unsigned short maxValue = forwardLutFromBitmap(bitmap, lut);
  applyLut(lut, &tmpBuffer.at(0), tmpBuffer.size());

  //
  // Store range compression info in _outBuffer
  //

  char *buf = reinterpret_cast<char *>(outPtr);

  memcpy(buf, &minNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);
  memcpy(buf, &maxNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);

  if (minNonZero <= maxNonZero) {
    memcpy(buf, (char *)&bitmap[0] + minNonZero, maxNonZero - minNonZero + 1);
    buf += maxNonZero - minNonZero + 1;
  }

  //
  // Apply wavelet encoding
  //

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Encode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Apply Huffman encoding; append the result to _outBuffer
  //

  // length header(4byte), then huff data. Initialize length header with zero,
  // then later fill it by `length`.
  char *lengthPtr = buf;
  int zero = 0;
  memcpy(buf, &zero, sizeof(int));
  buf += sizeof(int);

  int length = hufCompress(&tmpBuffer.at(0), tmpBuffer.size(), buf);
  memcpy(lengthPtr, &length, sizeof(int));

  outSize = (reinterpret_cast<unsigned char *>(buf) - outPtr) + length;
  return true;
}